

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall
TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>::Push
          (TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit> *this,TexInit *item)

{
  uint uVar1;
  
  Grow(this,1);
  FMultiPatchTexture::TexInit::TexInit(this->Array + this->Count,item);
  uVar1 = this->Count;
  this->Count = uVar1 + 1;
  return uVar1;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}